

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::find(Value *this,char *key,char *end)

{
  iterator iVar1;
  undefined8 extraout_RAX;
  Value *pVVar2;
  CZString actualKey;
  string local_1a0;
  key_type local_180 [23];
  
  if (this->field_0x8 == '\0') {
    pVVar2 = (Value *)0x0;
  }
  else {
    if (this->field_0x8 != '\a') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
      std::operator<<((ostream *)local_180,
                      "in Json::Value::find(key, end, found): requires objectValue or nullValue");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
      _Unwind_Resume(extraout_RAX);
    }
    local_180[0].field_1.index_ = ((int)end - (int)key) * 4;
    local_180[0].cstr_ = key;
    iVar1 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,local_180);
    pVVar2 = (Value *)0x0;
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
      pVVar2 = (Value *)&iVar1._M_node[1]._M_left;
    }
    CZString::~CZString(local_180);
  }
  return pVVar2;
}

Assistant:

Value const* Value::find(char const* key, char const* end) const
{
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::find(key, end, found): requires objectValue or nullValue");
  if (type_ == nullValue) return NULL;
  CZString actualKey(key, static_cast<unsigned>(end-key), CZString::noDuplication);
  ObjectValues::const_iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end()) return NULL;
  return &(*it).second;
}